

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O2

void __thiscall slang::ast::UnrollVisitor::handle(UnrollVisitor *this,ExpressionStatement *stmt)

{
  __uniq_ptr_impl<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
  *this_00;
  group_type_pointer pgVar1;
  undefined4 uVar2;
  AssignmentExpression *pAVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *pSVar6;
  int iVar7;
  undefined1 auVar8 [16];
  UnrollVisitor *pUVar9;
  ulong pos0;
  size_type sVar10;
  pointer ppVar11;
  PerAssignDriverState *state;
  undefined8 *puVar12;
  SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
  *results;
  ulong uVar13;
  ulong hash;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  IntervalMap<unsigned_long,_std::monostate,_0U> *this_01;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
  prefixes;
  try_emplace_args_t local_91;
  UnrollVisitor *local_90;
  AssignmentExpression *local_88;
  SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
  local_80;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_90 = this;
  step(this);
  pUVar9 = local_90;
  pAVar3 = (AssignmentExpression *)stmt->expr;
  if ((pAVar3->super_Expression).kind == Assignment) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = pAVar3;
    hash = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(local_90->driverMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
                          .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    ppVar4 = (local_90->driverMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
             .arrays.elements_;
    uVar5 = (local_90->driverMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
            .arrays.groups_size_mask;
    uVar13 = 0;
    uVar16 = pos0;
    do {
      pgVar1 = (local_90->driverMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
               .arrays.groups_ + uVar16;
      local_48 = pgVar1->m[0].n;
      uStack_47 = pgVar1->m[1].n;
      uStack_46 = pgVar1->m[2].n;
      bStack_45 = pgVar1->m[3].n;
      uStack_44 = pgVar1->m[4].n;
      uStack_43 = pgVar1->m[5].n;
      uStack_42 = pgVar1->m[6].n;
      bStack_41 = pgVar1->m[7].n;
      uStack_40 = pgVar1->m[8].n;
      uStack_3f = pgVar1->m[9].n;
      uStack_3e = pgVar1->m[10].n;
      bStack_3d = pgVar1->m[0xb].n;
      uStack_3c = pgVar1->m[0xc].n;
      uStack_3b = pgVar1->m[0xd].n;
      uStack_3a = pgVar1->m[0xe].n;
      bStack_39 = pgVar1->m[0xf].n;
      uVar17 = (uchar)uVar2;
      auVar21[0] = -(local_48 == uVar17);
      uVar18 = (uchar)((uint)uVar2 >> 8);
      auVar21[1] = -(uStack_47 == uVar18);
      uVar19 = (uchar)((uint)uVar2 >> 0x10);
      auVar21[2] = -(uStack_46 == uVar19);
      bVar20 = (byte)((uint)uVar2 >> 0x18);
      auVar21[3] = -(bStack_45 == bVar20);
      auVar21[4] = -(uStack_44 == uVar17);
      auVar21[5] = -(uStack_43 == uVar18);
      auVar21[6] = -(uStack_42 == uVar19);
      auVar21[7] = -(bStack_41 == bVar20);
      auVar21[8] = -(uStack_40 == uVar17);
      auVar21[9] = -(uStack_3f == uVar18);
      auVar21[10] = -(uStack_3e == uVar19);
      auVar21[0xb] = -(bStack_3d == bVar20);
      auVar21[0xc] = -(uStack_3c == uVar17);
      auVar21[0xd] = -(uStack_3b == uVar18);
      auVar21[0xe] = -(uStack_3a == uVar19);
      auVar21[0xf] = -(bStack_39 == bVar20);
      for (uVar14 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe); local_88 = pAVar3
          , uVar14 != 0; uVar14 = uVar14 - 1 & uVar14) {
        iVar7 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
          }
        }
        if (pAVar3 == *(AssignmentExpression **)
                       ((long)&ppVar4[uVar16 * 0xf].first + (ulong)(uint)(iVar7 << 4))) {
          sVar10 = (long)&ppVar4[uVar16 * 0xf].first + (ulong)(uint)(iVar7 << 4);
          goto LAB_007808c6;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
      lVar15 = uVar16 + uVar13;
      uVar13 = uVar13 + 1;
      uVar16 = lVar15 + 1U & uVar5;
    } while (uVar13 <= uVar5);
    if ((local_90->driverMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
        .size_ctrl.size <
        (local_90->driverMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::AssignmentExpression_const*>
                ((locator *)&local_80,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
                  *)&local_90->driverMap,pos0,hash,&local_91,&local_88);
      sVar10 = local_80.
               super_SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
               .cap;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::AssignmentExpression_const*>
                ((locator *)&local_80,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
                  *)&local_90->driverMap,hash,&local_91,&local_88);
      sVar10 = local_80.
               super_SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
               .cap;
    }
LAB_007808c6:
    this_00 = (__uniq_ptr_impl<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
               *)(sVar10 + 8);
    if (*(long *)(sVar10 + 8) == 0) {
      std::make_unique<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>();
      ppVar11 = local_80.
                super_SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
                .data_;
      local_80.
      super_SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
      .data_ = (pointer)0x0;
      std::
      __uniq_ptr_impl<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
      ::reset(this_00,(pointer)ppVar11);
      std::
      unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
      ::~unique_ptr((unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
                     *)&local_80);
    }
    if (pUVar9->setupMode == true) {
      local_80.
      super_SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
      .data_ = (pointer)local_80.
                        super_SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
                        .firstElement;
      local_80.
      super_SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
      .len = 0;
      local_80.
      super_SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
      .cap = 2;
      results = &local_80;
      Expression::getLongestStaticPrefixes(pAVar3->left_,results,&pUVar9->evalCtx,(Expression *)0x0)
      ;
      ppVar11 = local_80.
                super_SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
                .data_;
      for (lVar15 = local_80.
                    super_SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
                    .len << 4; lVar15 != 0; lVar15 = lVar15 + -0x10) {
        results = (SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
                   *)ppVar11->second;
        SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>::
        emplace_back<slang::ast::Expression_const&,slang::ast::ValueSymbol_const&>
                  (&((this_00->_M_t).
                     super__Tuple_impl<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
                     .
                     super__Head_base<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_false>
                    ._M_head_impl)->
                    super_SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>,
                   (Expression *)results,ppVar11->first);
        ppVar11 = ppVar11 + 1;
      }
      SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>::
      cleanup(&local_80.
               super_SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
              ,(EVP_PKEY_CTX *)results);
    }
    else {
      pSVar6 = (this_00->_M_t).
               super__Tuple_impl<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
               .
               super__Head_base<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_false>
               ._M_head_impl;
      puVar12 = &(((pSVar6->super_SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>).
                  data_)->longestStaticPrefix).ptr;
      this_01 = (IntervalMap<unsigned_long,_std::monostate,_0U> *)(puVar12 + 3);
      for (lVar15 = (pSVar6->super_SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>)
                    .len * 0xe0; lVar15 != 0; lVar15 = lVar15 + -0xe0) {
        ValueDriver::getBounds
                  ((optional<std::pair<unsigned_long,_unsigned_long>_> *)&local_80,
                   (Expression *)*puVar12,&pUVar9->evalCtx,(Type *)puVar12[2]);
        if ((char)local_80.
                  super_SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
                  .cap == '\x01') {
          IntervalMap<unsigned_long,_std::monostate,_0U>::unionWith
                    (this_01,(pair<unsigned_long,_unsigned_long> *)&local_80,(monostate *)&local_88,
                     &local_90->comp->unrollIntervalMapAllocator);
        }
        puVar12 = puVar12 + 0x1c;
        this_01 = (IntervalMap<unsigned_long,_std::monostate,_0U> *)
                  &this_01[1].field_0.rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
                   .first[1].right;
      }
    }
  }
  return;
}

Assistant:

void handle(const ExpressionStatement& stmt) {
        step();
        if (stmt.expr.kind != ExpressionKind::Assignment)
            return;

        auto& assign = stmt.expr.as<AssignmentExpression>();
        auto& driverState = driverMap[&assign];
        if (!driverState)
            driverState = std::make_unique<SmallVector<PerAssignDriverState>>();

        if (setupMode) {
            SmallVector<std::pair<const ValueSymbol*, const Expression*>> prefixes;
            assign.left().getLongestStaticPrefixes(prefixes, evalCtx);

            for (auto [symbol, expr] : prefixes)
                driverState->emplace_back(*expr, *symbol);
        }
        else {
            for (auto& state : *driverState) {
                auto bounds = ValueDriver::getBounds(*state.longestStaticPrefix, evalCtx,
                                                     *state.rootType);
                if (bounds) {
                    state.intervals.unionWith(*bounds, {}, comp.getUnrollIntervalMapAllocator());
                }
            }
        }
    }